

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O0

int Cec_ManSeqResimulateCounter(Gia_Man_t *pAig,Cec_ParSim_t *pPars,Abc_Cex_t *pCex)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  Vec_Ptr_t *vInfo;
  abctime aVar4;
  abctime clkTotal;
  int RetValue;
  Vec_Ptr_t *vSimInfo;
  Abc_Cex_t *pCex_local;
  Cec_ParSim_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  aVar3 = Abc_Clock();
  if (pCex == (Abc_Cex_t *)0x0) {
    Abc_Print(1,"Cec_ManSeqResimulateCounter(): Counter-example is not available.\n");
    pAig_local._4_4_ = -1;
  }
  else if (pAig->pReprs == (Gia_Rpr_t *)0x0) {
    Abc_Print(1,"Cec_ManSeqResimulateCounter(): Equivalence classes are not available.\n");
    pAig_local._4_4_ = -1;
  }
  else {
    iVar1 = Gia_ManRegNum(pAig);
    if (iVar1 == 0) {
      Abc_Print(1,"Cec_ManSeqResimulateCounter(): Not a sequential AIG.\n");
      pAig_local._4_4_ = -1;
    }
    else {
      iVar1 = Gia_ManPiNum(pAig);
      if (iVar1 == pCex->nPis) {
        if (pPars->fVerbose != 0) {
          Abc_Print(1,"Resimulating %d timeframes.\n",(ulong)(pPars->nFrames + pCex->iFrame + 1));
        }
        Gia_ManRandom(1);
        iVar1 = Gia_ManRegNum(pAig);
        iVar2 = Gia_ManPiNum(pAig);
        vInfo = Vec_PtrAllocSimInfo(iVar1 + iVar2 * (pPars->nFrames + pCex->iFrame + 1),1);
        Cec_ManSeqDeriveInfoFromCex(vInfo,pAig,pCex);
        if (pPars->fVerbose != 0) {
          Gia_ManEquivPrintClasses(pAig,0,0.0);
        }
        pAig_local._4_4_ = Cec_ManSeqResimulateInfo(pAig,vInfo,(Abc_Cex_t *)0x0,pPars->fCheckMiter);
        if (pPars->fVerbose != 0) {
          Gia_ManEquivPrintClasses(pAig,0,0.0);
        }
        Vec_PtrFree(vInfo);
        if (pPars->fVerbose != 0) {
          Abc_Print(1,"%s =","Time");
          aVar4 = Abc_Clock();
          Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
        }
      }
      else {
        Abc_Print(1,
                  "Cec_ManSeqResimulateCounter(): The number of PIs in the AIG and the counter-example differ.\n"
                 );
        pAig_local._4_4_ = -1;
      }
    }
  }
  return pAig_local._4_4_;
}

Assistant:

int Cec_ManSeqResimulateCounter( Gia_Man_t * pAig, Cec_ParSim_t * pPars, Abc_Cex_t * pCex )
{
    Vec_Ptr_t * vSimInfo;
    int RetValue;
    abctime clkTotal = Abc_Clock();
    if ( pCex == NULL )
    {
        Abc_Print( 1, "Cec_ManSeqResimulateCounter(): Counter-example is not available.\n" );
        return -1;
    }
    if ( pAig->pReprs == NULL )
    {
        Abc_Print( 1, "Cec_ManSeqResimulateCounter(): Equivalence classes are not available.\n" );
        return -1;
    }
    if ( Gia_ManRegNum(pAig) == 0 )
    {
        Abc_Print( 1, "Cec_ManSeqResimulateCounter(): Not a sequential AIG.\n" );
        return -1;
    }
//    if ( Gia_ManRegNum(pAig) != pCex->nRegs || Gia_ManPiNum(pAig) != pCex->nPis )
    if ( Gia_ManPiNum(pAig) != pCex->nPis )
    {
        Abc_Print( 1, "Cec_ManSeqResimulateCounter(): The number of PIs in the AIG and the counter-example differ.\n" );
        return -1;
    }
    if ( pPars->fVerbose )
        Abc_Print( 1, "Resimulating %d timeframes.\n", pPars->nFrames + pCex->iFrame + 1 );
    Gia_ManRandom( 1 );
    vSimInfo = Vec_PtrAllocSimInfo( Gia_ManRegNum(pAig) + 
        Gia_ManPiNum(pAig) * (pPars->nFrames + pCex->iFrame + 1), 1 );
    Cec_ManSeqDeriveInfoFromCex( vSimInfo, pAig, pCex );
    if ( pPars->fVerbose )
        Gia_ManEquivPrintClasses( pAig, 0, 0 );
    RetValue = Cec_ManSeqResimulateInfo( pAig, vSimInfo, NULL, pPars->fCheckMiter );
    if ( pPars->fVerbose )
        Gia_ManEquivPrintClasses( pAig, 0, 0 );
    Vec_PtrFree( vSimInfo );
    if ( pPars->fVerbose )
        ABC_PRT( "Time", Abc_Clock() - clkTotal );
//    if ( RetValue && pPars->fCheckMiter )
//        Abc_Print( 1, "Cec_ManSeqResimulateCounter(): An output of the miter is asserted!\n" );
    return RetValue;
}